

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::DecomposePair_NotDecomposable_Test::~DecomposePair_NotDecomposable_Test
          (DecomposePair_NotDecomposable_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DecomposePair, NotDecomposable) {
  auto f = [](...) {
    ADD_FAILURE() << "Must not be called";
    return 'A';
  };
  EXPECT_STREQ("not decomposable",
               TryDecomposePair(f));
  EXPECT_STREQ("not decomposable",
               TryDecomposePair(f, std::piecewise_construct, std::make_tuple(),
                                std::make_tuple(0.5)));
}